

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::CuePoint::Load(CuePoint *this,IMkvReader *pReader)

{
  undefined1 auVar1 [16];
  CuePoint *pCVar2;
  long lVar3;
  bool bVar4;
  longlong lVar5;
  longlong lVar6;
  TrackPosition *this_00;
  long unaff_RBP;
  TrackPosition *pTVar7;
  ulong uVar8;
  long lVar9;
  long pos;
  long lVar10;
  long len;
  long local_58;
  CuePoint *local_50;
  long local_48;
  long local_40;
  longlong local_38;
  
  local_40 = this->m_timecode;
  if (-1 < local_40) {
    return true;
  }
  if (this->m_track_positions != (TrackPosition *)0x0) {
    __assert_fail("m_track_positions == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x8eb,"bool mkvparser::CuePoint::Load(IMkvReader *)");
  }
  if (this->m_track_positions_count != 0) {
    __assert_fail("m_track_positions_count == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x8ec,"bool mkvparser::CuePoint::Load(IMkvReader *)");
  }
  lVar9 = -local_40;
  lVar5 = ReadID(pReader,lVar9,&local_58);
  local_38 = lVar9;
  if (lVar5 == 0xbb) {
    lVar9 = local_58 - local_40;
    lVar6 = ReadUInt(pReader,lVar9,&local_58);
    if (lVar6 < 0) {
      __assert_fail("size >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x8fd,"bool mkvparser::CuePoint::Load(IMkvReader *)");
    }
    lVar9 = lVar9 + local_58;
    unaff_RBP = lVar6 + lVar9;
  }
  if (lVar5 == 0xbb) {
    local_40 = local_40 + unaff_RBP;
    lVar10 = lVar9;
    local_50 = this;
    local_48 = unaff_RBP;
    do {
      lVar3 = local_48;
      pCVar2 = local_50;
      if (local_48 <= lVar10) {
        if (local_50->m_timecode < 0) {
          return false;
        }
        if (local_50->m_track_positions_count == 0) {
          return false;
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_50->m_track_positions_count;
        uVar8 = 0xffffffffffffffff;
        if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
          uVar8 = SUB168(auVar1 * ZEXT816(0x18),0);
        }
        this_00 = (TrackPosition *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
        pCVar2->m_track_positions = this_00;
        if (this_00 == (TrackPosition *)0x0) {
          return false;
        }
        do {
          if (local_48 <= lVar9) {
            if (((long)this_00 - (long)local_50->m_track_positions >> 3) * -0x5555555555555555 -
                local_50->m_track_positions_count != 0) {
              __assert_fail("size_t(p - m_track_positions) == m_track_positions_count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x955,"bool mkvparser::CuePoint::Load(IMkvReader *)");
            }
            local_50->m_element_start = local_38;
            local_50->m_element_size = local_40;
            return true;
          }
          lVar5 = ReadID(pReader,lVar9,&local_58);
          pTVar7 = this_00;
          if (lVar5 < 0) {
            bVar4 = false;
          }
          else {
            lVar10 = local_58 + lVar9;
            if (local_48 < lVar10) {
              bVar4 = false;
            }
            else {
              lVar6 = ReadUInt(pReader,lVar10,&local_58);
              if (lVar6 < 0) {
                __assert_fail("size >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                              ,0x943,"bool mkvparser::CuePoint::Load(IMkvReader *)");
              }
              lVar10 = lVar10 + local_58;
              if (local_48 < lVar10) {
                __assert_fail("(pos + len) <= stop",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                              ,0x944,"bool mkvparser::CuePoint::Load(IMkvReader *)");
              }
              lVar9 = lVar6 + lVar10;
              if (local_48 < lVar9) {
                __assert_fail("(pos + size) <= stop",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                              ,0x947,"bool mkvparser::CuePoint::Load(IMkvReader *)");
              }
              bVar4 = true;
              if (lVar5 == 0xb7) {
                pTVar7 = this_00 + 1;
                bVar4 = TrackPosition::Parse(this_00,pReader,lVar10,lVar6);
                if (!bVar4) {
                  lVar9 = lVar10;
                }
              }
            }
          }
          this_00 = pTVar7;
          if (bVar4 == false) {
            return false;
          }
        } while( true );
      }
      lVar5 = ReadID(pReader,lVar10,&local_58);
      if (lVar5 < 0) {
        bVar4 = false;
        pos = lVar10;
      }
      else {
        pos = local_58 + lVar10;
        if (lVar3 < pos) {
LAB_00112c3a:
          bVar4 = false;
          pos = lVar10;
        }
        else {
          lVar6 = ReadUInt(pReader,pos,&local_58);
          if ((lVar6 < 0) || (lVar10 = local_58 + pos, lVar3 < lVar10)) {
            bVar4 = false;
          }
          else {
            pos = lVar10 + lVar6;
            if (lVar3 < pos) goto LAB_00112c3a;
            bVar4 = true;
            if (lVar5 == 0xb7) {
              local_50->m_track_positions_count = local_50->m_track_positions_count + 1;
            }
            else if (lVar5 == 0xb3) {
              lVar5 = UnserializeUInt(pReader,lVar10,lVar6);
              local_50->m_timecode = lVar5;
            }
          }
        }
      }
      lVar10 = pos;
    } while (bVar4);
  }
  return false;
}

Assistant:

bool CuePoint::Load(IMkvReader* pReader) {
  // odbgstream os;
  // os << "CuePoint::Load(begin): timecode=" << m_timecode << endl;

  if (m_timecode >= 0)  // already loaded
    return true;

  assert(m_track_positions == NULL);
  assert(m_track_positions_count == 0);

  long long pos_ = -m_timecode;
  const long long element_start = pos_;

  long long stop;

  {
    long len;

    const long long id = ReadID(pReader, pos_, len);
    if (id != libwebm::kMkvCuePoint)
      return false;

    pos_ += len;  // consume ID

    const long long size = ReadUInt(pReader, pos_, len);
    assert(size >= 0);

    pos_ += len;  // consume Size field
    // pos_ now points to start of payload

    stop = pos_ + size;
  }

  const long long element_size = stop - element_start;

  long long pos = pos_;

  // First count number of track positions

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTime)
      m_timecode = UnserializeUInt(pReader, pos, size);

    else if (id == libwebm::kMkvCueTrackPositions)
      ++m_track_positions_count;

    pos += size;  // consume payload
  }

  if (m_timecode < 0 || m_track_positions_count <= 0) {
    return false;
  }

  // os << "CuePoint::Load(cont'd): idpos=" << idpos
  //   << " timecode=" << m_timecode
  //   << endl;

  m_track_positions = new (std::nothrow) TrackPosition[m_track_positions_count];
  if (m_track_positions == NULL)
    return false;

  // Now parse track positions

  TrackPosition* p = m_track_positions;
  pos = pos_;

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return false;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);
    assert((pos + len) <= stop);

    pos += len;  // consume Size field
    assert((pos + size) <= stop);

    if (id == libwebm::kMkvCueTrackPositions) {
      TrackPosition& tp = *p++;
      if (!tp.Parse(pReader, pos, size)) {
        return false;
      }
    }

    pos += size;  // consume payload
    if (pos > stop)
      return false;
  }

  assert(size_t(p - m_track_positions) == m_track_positions_count);

  m_element_start = element_start;
  m_element_size = element_size;

  return true;
}